

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Little_Hexy.cpp
# Opt level: O0

vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *
chrono::copter::Little_Hexy::getPosVect(void)

{
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *in_RDI;
  double dVar1;
  double dVar2;
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  undefined1 local_40 [8];
  ChVector<double> pos;
  double R;
  double ang;
  int i;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *ppos;
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector(in_RDI);
  for (ang._0_4_ = 0; ang._0_4_ < 6; ang._0_4_ = ang._0_4_ + 1) {
    auVar3._0_8_ = (double)ang._0_4_ / 3.0;
    auVar3._8_8_ = in_XMM0_Qb;
    auVar3 = vfmadd213sd_fma(ZEXT816(0x400921fb54442d18),auVar3,ZEXT816(0x3fe0c152382d7365));
    pos.m_data[2] = 0.762;
    dVar1 = cos(auVar3._0_8_);
    dVar1 = dVar1 * pos.m_data[2];
    dVar2 = sin(auVar3._0_8_);
    in_XMM0_Qb = 0;
    ChVector<double>::ChVector((ChVector<double> *)local_40,dVar1,dVar2 * pos.m_data[2],0.279);
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (in_RDI,(value_type *)local_40);
  }
  return in_RDI;
}

Assistant:

std::vector<ChVector<>> Little_Hexy::getPosVect() {
    std::vector<ChVector<>> ppos;
    for (int i = 0; i < 6; i++) {
        double ang = CH_C_PI * (i / 3.0) + CH_C_PI / 6;
        double R = 0.762;
        ChVector<> pos(std::cos(ang) * R, std::sin(ang) * R, 0.279);
        ppos.push_back(pos);
    }
    return ppos;
}